

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [376];
  Option *local_20;
  Option *opt_local;
  Formatter *this_local;
  
  local_20 = opt;
  opt_local = (Option *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(local_1c8,this,local_20,1);
  ::std::operator<<(local_198,local_1c8);
  ::std::__cxx11::string::~string(local_1c8);
  iVar2 = Option::get_expected(local_20);
  if (iVar2 < 2) {
    iVar2 = Option::get_expected(local_20);
    if (iVar2 < 0) {
      ::std::operator<<(local_198,"...");
    }
  }
  else {
    poVar3 = ::std::operator<<(local_198,"(");
    iVar2 = Option::get_expected(local_20);
    std::__cxx11::to_string(&local_1f8,iVar2);
    poVar3 = ::std::operator<<(poVar3,(string *)&local_1f8);
    ::std::operator<<(poVar3,"x)");
    ::std::__cxx11::string::~string((string *)&local_1f8);
  }
  bVar1 = OptionBase<CLI::Option>::get_required(&local_20->super_OptionBase<CLI::Option>);
  if (bVar1) {
    ::std::__cxx11::stringstream::str();
  }
  else {
    ::std::__cxx11::stringstream::str();
    ::std::operator+(&local_218,"[",&local_238);
    ::std::operator+(__return_storage_ptr__,&local_218,"]");
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string((string *)&local_238);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);

    if(opt->get_expected() > 1)
        out << "(" << std::to_string(opt->get_expected()) << "x)";
    else if(opt->get_expected() < 0)
        out << "...";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}